

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O2

CURLcode singleipconnect(connectdata *conn,Curl_addrinfo *ai,curl_socket_t *sockp)

{
  undefined1 *puVar1;
  Curl_easy *pCVar2;
  byte *__s;
  long lVar3;
  bool bVar4;
  curl_socket_t __fd;
  _Bool _Var5;
  ushort uVar6;
  CURLcode CVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  if2ip_result_t iVar11;
  ulong uVar12;
  size_t sVar13;
  int *piVar14;
  uint *puVar15;
  int iVar16;
  char *pcVar17;
  socklen_t __len;
  uint uVar18;
  Curl_easy *pCVar19;
  char *__nptr;
  curltime cVar20;
  long lStack_360;
  curl_socket_t sockfd;
  byte *local_348;
  uint local_33c;
  Curl_easy *local_338;
  uint local_32c;
  uint *local_328;
  Curl_easy *local_320;
  Curl_dns_entry *h;
  uint local_310;
  int optval;
  long port;
  curl_socklen_t size;
  curl_socklen_t onoff;
  undefined1 auStack_2f4 [4];
  char acStack_2f0 [16];
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  char ipaddress [46];
  Curl_sockaddr_ex addr;
  char buffer [128];
  char buffer_1 [128];
  
  pCVar19 = conn->data;
  optval = 1;
  *sockp = -1;
  CVar7 = Curl_socket(conn,ai,&addr,&sockfd);
  if (CVar7 != CURLE_OK) {
    return CURLE_OK;
  }
  _Var5 = getaddressinfo(&addr._sa_ex_u.addr,ipaddress,&port);
  if (!_Var5) {
    puVar15 = (uint *)__errno_location();
    uVar18 = *puVar15;
    pcVar17 = Curl_strerror(uVar18,buffer,0x80);
    Curl_failf(pCVar19,"sa_addr inet_ntop() failed with errno %d: %s",(ulong)uVar18,pcVar17);
    Curl_closesocket(conn,sockfd);
    return CURLE_OK;
  }
  Curl_infof(pCVar19,"  Trying %s:%ld...\n",ipaddress,port);
  if (((addr.family & 0xfffffff7U) == 2) && (addr.socktype == 1)) {
    uVar12 = *(ulong *)&(pCVar19->set).field_0x878;
    if ((uVar12 >> 0x23 & 1) != 0) {
      pCVar2 = conn->data;
      onoff = 1;
      iVar8 = setsockopt(sockfd,6,1,&onoff,4);
      if (iVar8 < 0) {
        piVar14 = __errno_location();
        pcVar17 = Curl_strerror(*piVar14,buffer,0x80);
        Curl_infof(pCVar2,"Could not set TCP_NODELAY: %s\n",pcVar17);
      }
      else {
        Curl_infof(pCVar2,"TCP_NODELAY set\n");
      }
      uVar12 = *(ulong *)&(pCVar19->set).field_0x878;
    }
    __fd = sockfd;
    if ((uVar12 >> 0x2b & 1) != 0) {
      uVar12 = (ulong)(uint)sockfd;
      buffer[0] = '\x01';
      buffer[1] = '\0';
      buffer[2] = '\0';
      buffer[3] = '\0';
      iVar8 = setsockopt(sockfd,1,9,buffer,4);
      if (iVar8 < 0) {
        pcVar17 = "Failed to set SO_KEEPALIVE on fd %d\n";
      }
      else {
        iVar8 = curlx_sltosi((pCVar19->set).tcp_keepidle);
        buffer[0] = (char)iVar8;
        buffer[1] = (char)((uint)iVar8 >> 8);
        buffer[2] = (char)((uint)iVar8 >> 0x10);
        buffer[3] = (char)((uint)iVar8 >> 0x18);
        iVar8 = setsockopt(__fd,6,4,buffer,4);
        if (iVar8 < 0) {
          Curl_infof(pCVar19,"Failed to set TCP_KEEPIDLE on fd %d\n",uVar12);
        }
        iVar8 = curlx_sltosi((pCVar19->set).tcp_keepintvl);
        buffer[0] = (char)iVar8;
        buffer[1] = (char)((uint)iVar8 >> 8);
        buffer[2] = (char)((uint)iVar8 >> 0x10);
        buffer[3] = (char)((uint)iVar8 >> 0x18);
        iVar8 = setsockopt(__fd,6,5,buffer,4);
        if (-1 < iVar8) goto LAB_00109b03;
        pcVar17 = "Failed to set TCP_KEEPINTVL on fd %d\n";
      }
      Curl_infof(pCVar19,pcVar17,uVar12);
    }
  }
LAB_00109b03:
  uVar18 = sockfd;
  if ((pCVar19->set).fsockopt == (curl_sockopt_callback)0x0) {
LAB_00109b53:
    bVar4 = false;
  }
  else {
    Curl_set_in_callback(pCVar19,true);
    uVar18 = sockfd;
    iVar8 = (*(pCVar19->set).fsockopt)((pCVar19->set).sockopt_client,sockfd,CURLSOCKTYPE_IPCXN);
    Curl_set_in_callback(pCVar19,false);
    if (iVar8 == 0) goto LAB_00109b53;
    if (iVar8 != 2) {
      Curl_closesocket(conn,uVar18);
      return CURLE_ABORTED_BY_CALLBACK;
    }
    bVar4 = true;
  }
  puVar15 = (uint *)sockp;
  if ((addr.family & 0xfffffff7U) != 2) goto LAB_00109c84;
  local_33c = addr.family;
  local_328 = (uint *)sockp;
  uVar9 = Curl_ipv6_scope(&addr._sa_ex_u.addr);
  pCVar2 = conn->data;
  h = (Curl_dns_entry *)0x0;
  uVar6 = (pCVar2->set).localport;
  uVar12 = (ulong)uVar6;
  __s = (byte *)(pCVar2->set).str[8];
  puVar15 = local_328;
  if (uVar6 == 0 && __s == (byte *)0x0) goto LAB_00109c84;
  iVar8 = (pCVar2->set).localportrange;
  local_288 = 0;
  uStack_280 = 0;
  local_298 = 0;
  uStack_290 = 0;
  local_2a8 = 0;
  uStack_2a0 = 0;
  local_2b8 = 0;
  uStack_2b0 = 0;
  local_2c8 = 0;
  uStack_2c0 = 0;
  local_2d8 = 0;
  uStack_2d0 = 0;
  acStack_2f0[8] = '\0';
  acStack_2f0[9] = '\0';
  acStack_2f0[10] = '\0';
  acStack_2f0[0xb] = '\0';
  acStack_2f0[0xc] = '\0';
  acStack_2f0[0xd] = '\0';
  acStack_2f0[0xe] = '\0';
  acStack_2f0[0xf] = '\0';
  uStack_2e0 = 0;
  onoff._0_2_ = 0;
  onoff._2_1_ = '\0';
  onoff._3_1_ = '\0';
  auStack_2f4[0] = '\0';
  auStack_2f4[1] = '\0';
  auStack_2f4[2] = '\0';
  auStack_2f4[3] = '\0';
  acStack_2f0[0] = '\0';
  acStack_2f0[1] = '\0';
  acStack_2f0[2] = '\0';
  acStack_2f0[3] = '\0';
  acStack_2f0[4] = '\0';
  acStack_2f0[5] = '\0';
  acStack_2f0[6] = '\0';
  acStack_2f0[7] = '\0';
  local_338 = pCVar2;
  local_32c = uVar18;
  local_320 = pCVar19;
  local_310 = uVar9;
  if ((__s == (byte *)0x0) || (local_348 = __s, sVar13 = strlen((char *)__s), 0xfe < sVar13)) {
    if (local_33c == 2) {
LAB_00109fe6:
      onoff = CONCAT22(uVar6 << 8 | uVar6 >> 8,2);
      __len = 0x10;
    }
    else {
      __len = 0;
      if (local_33c == 10) {
        onoff = CONCAT22(uVar6 << 8 | uVar6 >> 8,10);
        __len = 0x1c;
      }
    }
LAB_00109ffd:
    while( true ) {
      iVar16 = bind(local_32c,(sockaddr *)&onoff,__len);
      uVar12 = uVar12 & 0xffff;
      if (-1 < iVar16) break;
      if (iVar8 < 2) {
        puVar15 = (uint *)__errno_location();
        pCVar19 = local_338;
        uVar18 = *puVar15;
        (local_338->state).os_errno = uVar18;
        pcVar17 = Curl_strerror(uVar18,buffer,0x80);
        Curl_failf(pCVar19,"bind failed with errno %d: %s",(ulong)uVar18,pcVar17);
        iVar11 = 0x2d;
        goto LAB_0010a19e;
      }
      iVar8 = iVar8 + -1;
      Curl_infof(local_338,"Bind to local port %hu failed, trying next\n",uVar12);
      uVar18 = (int)uVar12 + 1;
      uVar12 = (ulong)uVar18;
      uVar6 = (ushort)uVar18;
      onoff = CONCAT22(uVar6 << 8 | uVar6 >> 8,(sa_family_t)onoff);
    }
    size = 0x80;
    buffer[0] = '\0';
    buffer[1] = '\0';
    buffer[2] = '\0';
    buffer[3] = '\0';
    buffer[4] = '\0';
    buffer[5] = '\0';
    buffer[6] = '\0';
    buffer[7] = '\0';
    buffer[8] = '\0';
    buffer[9] = '\0';
    buffer[10] = '\0';
    buffer[0xb] = '\0';
    buffer[0xc] = '\0';
    buffer[0xd] = '\0';
    buffer[0xe] = '\0';
    buffer[0xf] = '\0';
    buffer[0x10] = '\0';
    buffer[0x11] = '\0';
    buffer[0x12] = '\0';
    buffer[0x13] = '\0';
    buffer[0x14] = '\0';
    buffer[0x15] = '\0';
    buffer[0x16] = '\0';
    buffer[0x17] = '\0';
    buffer[0x18] = '\0';
    buffer[0x19] = '\0';
    buffer[0x1a] = '\0';
    buffer[0x1b] = '\0';
    buffer[0x1c] = '\0';
    buffer[0x1d] = '\0';
    buffer[0x1e] = '\0';
    buffer[0x1f] = '\0';
    buffer[0x20] = '\0';
    buffer[0x21] = '\0';
    buffer[0x22] = '\0';
    buffer[0x23] = '\0';
    buffer[0x24] = '\0';
    buffer[0x25] = '\0';
    buffer[0x26] = '\0';
    buffer[0x27] = '\0';
    buffer[0x28] = '\0';
    buffer[0x29] = '\0';
    buffer[0x2a] = '\0';
    buffer[0x2b] = '\0';
    buffer[0x2c] = '\0';
    buffer[0x2d] = '\0';
    buffer[0x2e] = '\0';
    buffer[0x2f] = '\0';
    buffer[0x30] = '\0';
    buffer[0x31] = '\0';
    buffer[0x32] = '\0';
    buffer[0x33] = '\0';
    buffer[0x34] = '\0';
    buffer[0x35] = '\0';
    buffer[0x36] = '\0';
    buffer[0x37] = '\0';
    buffer[0x38] = '\0';
    buffer[0x39] = '\0';
    buffer[0x3a] = '\0';
    buffer[0x3b] = '\0';
    buffer[0x3c] = '\0';
    buffer[0x3d] = '\0';
    buffer[0x3e] = '\0';
    buffer[0x3f] = '\0';
    buffer[0x40] = '\0';
    buffer[0x41] = '\0';
    buffer[0x42] = '\0';
    buffer[0x43] = '\0';
    buffer[0x44] = '\0';
    buffer[0x45] = '\0';
    buffer[0x46] = '\0';
    buffer[0x47] = '\0';
    buffer[0x48] = '\0';
    buffer[0x49] = '\0';
    buffer[0x4a] = '\0';
    buffer[0x4b] = '\0';
    buffer[0x4c] = '\0';
    buffer[0x4d] = '\0';
    buffer[0x4e] = '\0';
    buffer[0x4f] = '\0';
    buffer[0x50] = '\0';
    buffer[0x51] = '\0';
    buffer[0x52] = '\0';
    buffer[0x53] = '\0';
    buffer[0x54] = '\0';
    buffer[0x55] = '\0';
    buffer[0x56] = '\0';
    buffer[0x57] = '\0';
    buffer[0x58] = '\0';
    buffer[0x59] = '\0';
    buffer[0x5a] = '\0';
    buffer[0x5b] = '\0';
    buffer[0x5c] = '\0';
    buffer[0x5d] = '\0';
    buffer[0x5e] = '\0';
    buffer[0x5f] = '\0';
    buffer[0x60] = '\0';
    buffer[0x61] = '\0';
    buffer[0x62] = '\0';
    buffer[99] = '\0';
    buffer[100] = '\0';
    buffer[0x65] = '\0';
    buffer[0x66] = '\0';
    buffer[0x67] = '\0';
    buffer[0x68] = '\0';
    buffer[0x69] = '\0';
    buffer[0x6a] = '\0';
    buffer[0x6b] = '\0';
    buffer[0x6c] = '\0';
    buffer[0x6d] = '\0';
    buffer[0x6e] = '\0';
    buffer[0x6f] = '\0';
    buffer[0x70] = '\0';
    buffer[0x71] = '\0';
    buffer[0x72] = '\0';
    buffer[0x73] = '\0';
    buffer[0x74] = '\0';
    buffer[0x75] = '\0';
    buffer[0x76] = '\0';
    buffer[0x77] = '\0';
    buffer[0x78] = '\0';
    buffer[0x79] = '\0';
    buffer[0x7a] = '\0';
    buffer[0x7b] = '\0';
    buffer[0x7c] = '\0';
    buffer[0x7d] = '\0';
    buffer[0x7e] = '\0';
    buffer[0x7f] = '\0';
    iVar8 = getsockname(local_32c,(sockaddr *)buffer,&size);
    if (iVar8 < 0) {
      puVar15 = (uint *)__errno_location();
      pCVar19 = local_338;
      uVar18 = *puVar15;
      (local_338->state).os_errno = uVar18;
      pcVar17 = Curl_strerror(uVar18,buffer_1,0x80);
      Curl_failf(pCVar19,"getsockname() failed with errno %d: %s",(ulong)uVar18,pcVar17);
      iVar11 = 0x2d;
    }
    else {
      iVar11 = IF2IP_NOT_FOUND;
      Curl_infof(local_338,"Local port: %hu\n",uVar12);
      puVar1 = &(conn->bits).field_0x7;
      *puVar1 = *puVar1 | 1;
    }
  }
  else {
    memset(buffer,0,0x100);
    iVar16 = *local_348 - 0x69;
    if ((iVar16 == 0) && (iVar16 = local_348[1] - 0x66, iVar16 == 0)) {
      iVar16 = 0x21 - (uint)local_348[2];
    }
    else {
      iVar16 = -iVar16;
    }
    if (iVar16 != 0) {
      iVar10 = strncmp("host!",(char *)local_348,5);
      if (iVar10 != 0) goto LAB_00109e10;
      local_348 = local_348 + 5;
      goto LAB_00109eb6;
    }
    local_348 = local_348 + 3;
LAB_00109e10:
    sVar13 = strlen((char *)local_348);
    iVar10 = setsockopt(uVar18,1,0x19,local_348,(int)sVar13 + 1);
    if (iVar10 == 0) {
      iVar11 = IF2IP_NOT_FOUND;
      goto LAB_0010a191;
    }
    iVar11 = Curl_if2ip(local_33c,local_310,conn->scope_id,(char *)local_348,buffer,0x100);
    uVar18 = local_33c;
    if (iVar11 == IF2IP_FOUND) {
      Curl_infof(local_338,"Local Interface %s is ip %s using address family %i\n",local_348,buffer,
                 (ulong)local_33c);
LAB_00109f99:
      __len = 0;
      if (uVar18 == 2) {
        iVar16 = inet_pton(2,buffer,auStack_2f4);
        if (0 < iVar16) goto LAB_00109fe6;
      }
      else {
        __len = 0;
        if (uVar18 == 10) {
          pcVar17 = strchr(buffer,0x25);
          if (pcVar17 == (char *)0x0) {
            __nptr = (char *)0x0;
          }
          else {
            __nptr = pcVar17 + 1;
            *pcVar17 = '\0';
          }
          iVar16 = inet_pton(10,buffer,acStack_2f0);
          __len = 0x1c;
          if (0 < iVar16) {
            onoff = CONCAT22(uVar6 << 8 | uVar6 >> 8,10);
            if (__nptr != (char *)0x0) {
              iVar16 = atoi(__nptr);
              uStack_2e0 = CONCAT44(uStack_2e0._4_4_,iVar16);
            }
          }
        }
      }
      goto LAB_00109ffd;
    }
    if (iVar11 != IF2IP_AF_NOT_SUPPORTED) {
      if (iVar11 == IF2IP_NOT_FOUND) {
        if (iVar16 != 0) goto LAB_00109eb6;
        Curl_failf(local_338,"Couldn\'t bind to interface \'%s\'",local_348);
        iVar11 = 0x2d;
      }
      else {
        if (iVar16 != 0) {
LAB_00109eb6:
          lVar3 = conn->ip_version;
          if (local_33c == 2) {
            lStack_360 = 1;
LAB_00109ed1:
            conn->ip_version = lStack_360;
          }
          else if (local_33c == 10) {
            lStack_360 = 2;
            goto LAB_00109ed1;
          }
          Curl_resolv(conn,(char *)local_348,0,false,&h);
          conn->ip_version = lVar3;
          if (h != (Curl_dns_entry *)0x0) {
            Curl_printable_address(h->addr,buffer,0x100);
            pCVar19 = local_338;
            uVar18 = local_33c;
            Curl_infof(local_338,"Name \'%s\' family %i resolved to \'%s\' family %i\n",local_348,
                       (ulong)local_33c,buffer,(ulong)(uint)h->addr->ai_family);
            Curl_resolv_unlock(pCVar19,h);
            goto LAB_00109f99;
          }
        }
        puVar1 = &(local_338->state).field_0x4e4;
        *puVar1 = *puVar1 & 0xf7;
        Curl_failf(local_338,"Couldn\'t bind to \'%s\'",local_348);
        iVar11 = 0x2d;
      }
    }
  }
LAB_0010a191:
  puVar15 = local_328;
  pCVar19 = local_320;
  uVar18 = sockfd;
  if (iVar11 != IF2IP_NOT_FOUND) {
LAB_0010a19e:
    Curl_closesocket(conn,sockfd);
    if (iVar11 == IF2IP_AF_NOT_SUPPORTED) {
      return CURLE_COULDNT_CONNECT;
    }
    return iVar11;
  }
LAB_00109c84:
  curlx_nonblock(uVar18,1);
  cVar20 = Curl_now();
  (conn->connecttime).tv_sec = cVar20.tv_sec;
  (conn->connecttime).tv_usec = cVar20.tv_usec;
  if (1 < conn->num_addr) {
    Curl_expire(pCVar19,conn->timeoutms_per_addr,EXPIRE_DNS_PER_NAME);
  }
  if ((!bVar4) && (conn->socktype == 1)) {
    if (((conn->bits).field_0x7 & 8) != 0) {
      iVar8 = setsockopt(uVar18,6,0x1e,&optval,4);
      if (iVar8 < 0) {
        Curl_infof(pCVar19,"Failed to enable TCP Fast Open on fd %d\n",(ulong)uVar18);
      }
      else {
        Curl_infof(pCVar19,"TCP_FASTOPEN_CONNECT set\n");
      }
    }
    iVar8 = connect(uVar18,(sockaddr *)&addr._sa_ex_u.addr,addr.addrlen);
    if (iVar8 == -1) {
      piVar14 = __errno_location();
      iVar8 = *piVar14;
      if ((iVar8 != 0xb) && (iVar8 != 0x73)) {
        pcVar17 = Curl_strerror(iVar8,buffer,0x80);
        Curl_infof(pCVar19,"Immediate connect fail for %s: %s\n",ipaddress,pcVar17);
        (pCVar19->state).os_errno = iVar8;
        Curl_closesocket(conn,uVar18);
        return CURLE_COULDNT_CONNECT;
      }
    }
  }
  *puVar15 = uVar18;
  return CURLE_OK;
}

Assistant:

static CURLcode singleipconnect(struct connectdata *conn,
                                const Curl_addrinfo *ai,
                                curl_socket_t *sockp)
{
  struct Curl_sockaddr_ex addr;
  int rc = -1;
  int error = 0;
  bool isconnected = FALSE;
  struct Curl_easy *data = conn->data;
  curl_socket_t sockfd;
  CURLcode result;
  char ipaddress[MAX_IPADR_LEN];
  long port;
  bool is_tcp;
#ifdef TCP_FASTOPEN_CONNECT
  int optval = 1;
#endif
  char buffer[STRERROR_LEN];

  *sockp = CURL_SOCKET_BAD;

  result = Curl_socket(conn, ai, &addr, &sockfd);
  if(result)
    /* Failed to create the socket, but still return OK since we signal the
       lack of socket as well. This allows the parent function to keep looping
       over alternative addresses/socket families etc. */
    return CURLE_OK;

  /* store remote address and port used in this connection attempt */
  if(!getaddressinfo((struct sockaddr*)&addr.sa_addr,
                     ipaddress, &port)) {
    /* malformed address or bug in inet_ntop, try next address */
    failf(data, "sa_addr inet_ntop() failed with errno %d: %s",
          errno, Curl_strerror(errno, buffer, sizeof(buffer)));
    Curl_closesocket(conn, sockfd);
    return CURLE_OK;
  }
  infof(data, "  Trying %s:%ld...\n", ipaddress, port);

#ifdef ENABLE_IPV6
  is_tcp = (addr.family == AF_INET || addr.family == AF_INET6) &&
    addr.socktype == SOCK_STREAM;
#else
  is_tcp = (addr.family == AF_INET) && addr.socktype == SOCK_STREAM;
#endif
  if(is_tcp && data->set.tcp_nodelay)
    tcpnodelay(conn, sockfd);

  nosigpipe(conn, sockfd);

  Curl_sndbufset(sockfd);

  if(is_tcp && data->set.tcp_keepalive)
    tcpkeepalive(data, sockfd);

  if(data->set.fsockopt) {
    /* activate callback for setting socket options */
    Curl_set_in_callback(data, true);
    error = data->set.fsockopt(data->set.sockopt_client,
                               sockfd,
                               CURLSOCKTYPE_IPCXN);
    Curl_set_in_callback(data, false);

    if(error == CURL_SOCKOPT_ALREADY_CONNECTED)
      isconnected = TRUE;
    else if(error) {
      Curl_closesocket(conn, sockfd); /* close the socket and bail out */
      return CURLE_ABORTED_BY_CALLBACK;
    }
  }

  /* possibly bind the local end to an IP, interface or port */
  if(addr.family == AF_INET
#ifdef ENABLE_IPV6
     || addr.family == AF_INET6
#endif
    ) {
    result = bindlocal(conn, sockfd, addr.family,
                       Curl_ipv6_scope((struct sockaddr*)&addr.sa_addr));
    if(result) {
      Curl_closesocket(conn, sockfd); /* close socket and bail out */
      if(result == CURLE_UNSUPPORTED_PROTOCOL) {
        /* The address family is not supported on this interface.
           We can continue trying addresses */
        return CURLE_COULDNT_CONNECT;
      }
      return result;
    }
  }

  /* set socket non-blocking */
  (void)curlx_nonblock(sockfd, TRUE);

  conn->connecttime = Curl_now();
  if(conn->num_addr > 1)
    Curl_expire(data, conn->timeoutms_per_addr, EXPIRE_DNS_PER_NAME);

  /* Connect TCP sockets, bind UDP */
  if(!isconnected && (conn->socktype == SOCK_STREAM)) {
    if(conn->bits.tcp_fastopen) {
#if defined(CONNECT_DATA_IDEMPOTENT) /* Darwin */
#  if defined(HAVE_BUILTIN_AVAILABLE)
      /* while connectx function is available since macOS 10.11 / iOS 9,
         it did not have the interface declared correctly until
         Xcode 9 / macOS SDK 10.13 */
      if(__builtin_available(macOS 10.11, iOS 9.0, tvOS 9.0, watchOS 2.0, *)) {
        sa_endpoints_t endpoints;
        endpoints.sae_srcif = 0;
        endpoints.sae_srcaddr = NULL;
        endpoints.sae_srcaddrlen = 0;
        endpoints.sae_dstaddr = &addr.sa_addr;
        endpoints.sae_dstaddrlen = addr.addrlen;

        rc = connectx(sockfd, &endpoints, SAE_ASSOCID_ANY,
                      CONNECT_RESUME_ON_READ_WRITE | CONNECT_DATA_IDEMPOTENT,
                      NULL, 0, NULL, NULL);
      }
      else {
        rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
      }
#  else
      rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
#  endif /* HAVE_BUILTIN_AVAILABLE */
#elif defined(TCP_FASTOPEN_CONNECT) /* Linux >= 4.11 */
      if(setsockopt(sockfd, IPPROTO_TCP, TCP_FASTOPEN_CONNECT,
                    (void *)&optval, sizeof(optval)) < 0)
        infof(data, "Failed to enable TCP Fast Open on fd %d\n", sockfd);
      else
        infof(data, "TCP_FASTOPEN_CONNECT set\n");

      rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
#elif defined(MSG_FASTOPEN) /* old Linux */
      if(conn->given->flags & PROTOPT_SSL)
        rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
      else
        rc = 0; /* Do nothing */
#endif
    }
    else {
      rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
    }

    if(-1 == rc)
      error = SOCKERRNO;
  }
  else {
    *sockp = sockfd;
    return CURLE_OK;
  }

  if(-1 == rc) {
    switch(error) {
    case EINPROGRESS:
    case EWOULDBLOCK:
#if defined(EAGAIN)
#if (EAGAIN) != (EWOULDBLOCK)
      /* On some platforms EAGAIN and EWOULDBLOCK are the
       * same value, and on others they are different, hence
       * the odd #if
       */
    case EAGAIN:
#endif
#endif
      result = CURLE_OK;
      break;

    default:
      /* unknown error, fallthrough and try another address! */
      infof(data, "Immediate connect fail for %s: %s\n",
            ipaddress, Curl_strerror(error, buffer, sizeof(buffer)));
      data->state.os_errno = error;

      /* connect failed */
      Curl_closesocket(conn, sockfd);
      result = CURLE_COULDNT_CONNECT;
    }
  }

  if(!result)
    *sockp = sockfd;

  return result;
}